

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucurr.cpp
# Opt level: O0

int32_t ucurr_forLocaleAndDate_63
                  (char *locale,UDate date,int32_t index,UChar *buff,int32_t buffCapacity,
                  UErrorCode *ec)

{
  int iVar1;
  UBool UVar2;
  int32_t iVar3;
  UResourceBundle *resB;
  int32_t *piVar4;
  UDate toDate;
  int32_t *toArray;
  UResourceBundle *toRes;
  double dStack_150;
  int32_t toLength;
  UDate fromDate;
  int64_t currDate64;
  int32_t *fromArray;
  UResourceBundle *fromRes;
  UResourceBundle *pUStack_128;
  int32_t fromLength;
  UResourceBundle *currencyRes;
  int32_t i;
  bool matchFound;
  UResourceBundle *countryArray;
  UResourceBundle *cm;
  UResourceBundle *rb;
  char *idDelim;
  char id [157];
  UChar *pUStack_50;
  UErrorCode localStatus;
  UChar *s;
  int32_t currIndex;
  int32_t resLen;
  UErrorCode *ec_local;
  UChar *pUStack_30;
  int32_t buffCapacity_local;
  UChar *buff_local;
  UDate UStack_20;
  int32_t index_local;
  UDate date_local;
  char *locale_local;
  
  s._4_4_ = 0;
  s._0_4_ = 0;
  pUStack_50 = (UChar *)0x0;
  if ((ec != (UErrorCode *)0x0) &&
     (_currIndex = ec, ec_local._4_4_ = buffCapacity, pUStack_30 = buff, buff_local._4_4_ = index,
     UStack_20 = date, date_local = (UDate)locale, UVar2 = U_SUCCESS(*ec), UVar2 != '\0')) {
    if (((pUStack_30 != (UChar *)0x0) && (ec_local._4_4_ != 0)) || (ec_local._4_4_ == 0)) {
      stack0xffffffffffffffac = U_ZERO_ERROR;
      s._4_4_ = uloc_getKeywordValue_63
                          ((char *)date_local,"currency",(char *)&idDelim,0x9d,
                           (UErrorCode *)(id + 0x9c));
      idForLocale((char *)date_local,(char *)&idDelim,0x9d,_currIndex);
      UVar2 = U_FAILURE(*_currIndex);
      if (UVar2 != '\0') {
        return 0;
      }
      rb = (UResourceBundle *)strchr((char *)&idDelim,0x5f);
      if (rb != (UResourceBundle *)0x0) {
        *(char *)&rb->fKey = '\0';
      }
      cm = ures_openDirect_63("icudt63l-curr","supplementalData",(UErrorCode *)(id + 0x9c));
      countryArray = ures_getByKey_63(cm,"CurrencyMap",cm,(UErrorCode *)(id + 0x9c));
      _i = ures_getByKey_63(cm,(char *)&idDelim,countryArray,(UErrorCode *)(id + 0x9c));
      currencyRes._7_1_ = 0;
      UVar2 = U_SUCCESS(stack0xffffffffffffffac);
      iVar1 = buff_local._4_4_;
      if (UVar2 != '\0') {
        if ((buff_local._4_4_ < 1) || (iVar3 = ures_getSize_63(_i), iVar3 < iVar1)) {
          ures_close_63(_i);
          return 0;
        }
        for (currencyRes._0_4_ = 0; iVar1 = (int)currencyRes, iVar3 = ures_getSize_63(_i),
            iVar1 < iVar3; currencyRes._0_4_ = (int)currencyRes + 1) {
          pUStack_128 = ures_getByIndex_63(_i,(int)currencyRes,(UResourceBundle *)0x0,
                                           (UErrorCode *)(id + 0x9c));
          pUStack_50 = ures_getStringByKey_63
                                 (pUStack_128,"id",(int32_t *)((long)&s + 4),
                                  (UErrorCode *)(id + 0x9c));
          fromRes._4_4_ = 0;
          fromArray = (int32_t *)
                      ures_getByKey_63(pUStack_128,"from",(UResourceBundle *)0x0,
                                       (UErrorCode *)(id + 0x9c));
          currDate64 = (int64_t)ures_getIntVector_63
                                          ((UResourceBundle *)fromArray,
                                           (int32_t *)((long)&fromRes + 4),(UErrorCode *)(id + 0x9c)
                                          );
          fromDate = (UDate)CONCAT44(*(int32_t *)currDate64,*(int32_t *)(currDate64 + 4));
          dStack_150 = (double)(long)fromDate;
          iVar3 = ures_getSize_63(pUStack_128);
          if (iVar3 < 3) {
            if ((dStack_150 <= UStack_20) && (s._0_4_ = (int)s + 1, (int)s == buff_local._4_4_)) {
              currencyRes._7_1_ = 1;
            }
          }
          else {
            toRes._4_4_ = 0;
            resB = ures_getByKey_63(pUStack_128,"to",(UResourceBundle *)0x0,
                                    (UErrorCode *)(id + 0x9c));
            piVar4 = ures_getIntVector_63
                               (resB,(int32_t *)((long)&toRes + 4),(UErrorCode *)(id + 0x9c));
            fromDate = (UDate)CONCAT44(*piVar4,piVar4[1]);
            if (((dStack_150 <= UStack_20) && (UStack_20 < (double)(long)fromDate)) &&
               (s._0_4_ = (int)s + 1, (int)s == buff_local._4_4_)) {
              currencyRes._7_1_ = 1;
            }
            ures_close_63(resB);
          }
          ures_close_63(pUStack_128);
          ures_close_63((UResourceBundle *)fromArray);
          if ((currencyRes._7_1_ & 1) != 0) break;
        }
      }
      ures_close_63(_i);
      if ((*_currIndex == U_ZERO_ERROR) || (stack0xffffffffffffffac != U_ZERO_ERROR)) {
        *_currIndex = stack0xffffffffffffffac;
      }
      UVar2 = U_SUCCESS(*_currIndex);
      if (UVar2 != '\0') {
        if ((ec_local._4_4_ <= s._4_4_) || ((currencyRes._7_1_ & 1) == 0)) {
          return 0;
        }
        u_strcpy_63(pUStack_30,pUStack_50);
      }
      iVar3 = u_terminateUChars_63(pUStack_30,ec_local._4_4_,s._4_4_,_currIndex);
      return iVar3;
    }
    *_currIndex = U_ILLEGAL_ARGUMENT_ERROR;
  }
  return s._4_4_;
}

Assistant:

U_CAPI int32_t U_EXPORT2 
ucurr_forLocaleAndDate(const char* locale, 
                UDate date, 
                int32_t index,
                UChar* buff, 
                int32_t buffCapacity, 
                UErrorCode* ec)
{
    int32_t resLen = 0;
	int32_t currIndex = 0;
    const UChar* s = NULL;

    if (ec != NULL && U_SUCCESS(*ec))
    {
        // check the arguments passed
        if ((buff && buffCapacity) || !buffCapacity )
        {
            // local variables
            UErrorCode localStatus = U_ZERO_ERROR;
            char id[ULOC_FULLNAME_CAPACITY];
            resLen = uloc_getKeywordValue(locale, "currency", id, ULOC_FULLNAME_CAPACITY, &localStatus);

            // get country or country_variant in `id'
            /*uint32_t variantType =*/ idForLocale(locale, id, sizeof(id), ec);
            if (U_FAILURE(*ec))
            {
                return 0;
            }

            // Remove variants, which is only needed for registration.
            char *idDelim = strchr(id, VAR_DELIM);
            if (idDelim)
            {
                idDelim[0] = 0;
            }

            // Look up the CurrencyMap element in the root bundle.
            UResourceBundle *rb = ures_openDirect(U_ICUDATA_CURR, CURRENCY_DATA, &localStatus);
            UResourceBundle *cm = ures_getByKey(rb, CURRENCY_MAP, rb, &localStatus);

            // Using the id derived from the local, get the currency data
            UResourceBundle *countryArray = ures_getByKey(rb, id, cm, &localStatus);

            // process each currency to see which one is valid for the given date
            bool matchFound = false;
            if (U_SUCCESS(localStatus))
            {
                if ((index <= 0) || (index> ures_getSize(countryArray)))
                {
                    // requested index is out of bounds
                    ures_close(countryArray);
                    return 0;
                }

                for (int32_t i=0; i<ures_getSize(countryArray); i++)
                {
                    // get the currency resource
                    UResourceBundle *currencyRes = ures_getByIndex(countryArray, i, NULL, &localStatus);
                    s = ures_getStringByKey(currencyRes, "id", &resLen, &localStatus);

                    // get the from date
                    int32_t fromLength = 0;
                    UResourceBundle *fromRes = ures_getByKey(currencyRes, "from", NULL, &localStatus);
                    const int32_t *fromArray = ures_getIntVector(fromRes, &fromLength, &localStatus);

                    int64_t currDate64 = (int64_t)fromArray[0] << 32;
                    currDate64 |= ((int64_t)fromArray[1] & (int64_t)INT64_C(0x00000000FFFFFFFF));
                    UDate fromDate = (UDate)currDate64;

                    if (ures_getSize(currencyRes)> 2)
                    {
                        int32_t toLength = 0;
                        UResourceBundle *toRes = ures_getByKey(currencyRes, "to", NULL, &localStatus);
                        const int32_t *toArray = ures_getIntVector(toRes, &toLength, &localStatus);

                        currDate64 = (int64_t)toArray[0] << 32;
                        currDate64 |= ((int64_t)toArray[1] & (int64_t)INT64_C(0x00000000FFFFFFFF));
                        UDate toDate = (UDate)currDate64;

                        if ((fromDate <= date) && (date < toDate))
                        {
                            currIndex++;
                            if (currIndex == index)
                            {
                                matchFound = true;
                            }
                        }

                        ures_close(toRes);
                    }
                    else
                    {
                        if (fromDate <= date)
                        {
                            currIndex++;
                            if (currIndex == index)
                            {
                                matchFound = true;
                            }
                        }
                    }

                    // close open resources
                    ures_close(currencyRes);
                    ures_close(fromRes);

                    // check for loop exit
                    if (matchFound)
                    {
                        break;
                    }

                } // end For loop
            }

            ures_close(countryArray);

            // Check for errors
            if (*ec == U_ZERO_ERROR || localStatus != U_ZERO_ERROR)
            {
                // There is nothing to fallback to. 
                // Report the failure/warning if possible.
                *ec = localStatus;
            }

            if (U_SUCCESS(*ec))
            {
                // no errors
                if((buffCapacity> resLen) && matchFound)
                {
                    // write out the currency value
                    u_strcpy(buff, s);
                }
                else
                {
                    return 0;
                }
            }

            // return null terminated currency string
            return u_terminateUChars(buff, buffCapacity, resLen, ec);
        }
        else
        {
            // illegal argument encountered
            *ec = U_ILLEGAL_ARGUMENT_ERROR;
        }

    }

    // If we got here, either error code is invalid or
    // some argument passed is no good.
    return resLen;
}